

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_add_remove_checked(void **param_1)

{
  uint32_t uVar1;
  bool bVar2;
  long lVar3;
  Roaring roaring;
  Roaring RStack_58;
  
  ::roaring::Roaring::Roaring(&RStack_58);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
    uVar1 = *(uint32_t *)((long)&DAT_00130290 + lVar3);
    bVar2 = ::roaring::Roaring::addChecked(&RStack_58,uVar1);
    _assert_true((ulong)bVar2,"roaring.addChecked(values[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2b9);
    bVar2 = ::roaring::Roaring::addChecked(&RStack_58,uVar1);
    _assert_true((ulong)!bVar2,"roaring.addChecked(values[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2ba);
  }
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
    uVar1 = *(uint32_t *)((long)&DAT_00130290 + lVar3);
    bVar2 = ::roaring::Roaring::removeChecked(&RStack_58,uVar1);
    _assert_true((ulong)bVar2,"roaring.removeChecked(values[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2bd);
    bVar2 = ::roaring::Roaring::removeChecked(&RStack_58,uVar1);
    _assert_true((ulong)!bVar2,"roaring.removeChecked(values[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2be);
  }
  bVar2 = ::roaring::Roaring::isEmpty(&RStack_58);
  _assert_true((ulong)bVar2,"roaring.isEmpty()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x2c0);
  ::roaring::Roaring::~Roaring(&RStack_58);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_remove_checked) {
    Roaring roaring;
    uint32_t values[4] = {123, 9999, 0xFFFFFFF7, 0xFFFFFFFF};
    for (int i = 0; i < 4; ++i) {
        assert_true(roaring.addChecked(values[i]));
        assert_false(roaring.addChecked(values[i]));
    }
    for (int i = 0; i < 4; ++i) {
        assert_true(roaring.removeChecked(values[i]));
        assert_false(roaring.removeChecked(values[i]));
    }
    assert_true(roaring.isEmpty());
}